

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O1

void __thiscall OpenMD::Component::validate(Component *this)

{
  int iVar1;
  pointer pcVar2;
  long lVar3;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if ((this->Type).super_ParameterBase.empty_ == false) {
    isNotEmpty();
    pcVar2 = (this->Type).data_._M_dataplus._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (this->Type).data_._M_string_length);
    lVar3 = local_48;
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (lVar3 == 0) {
      pcVar2 = (this->Type).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNotEmpty();
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,local_50,local_48 + (long)local_50);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,local_70[0]);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->NMol).super_ParameterBase.empty_ == false) {
    isPositive();
    iVar1 = *(int *)&(this->NMol).super_ParameterBase.field_0x2c;
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (iVar1 < 1) {
      pcVar2 = (this->NMol).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,local_50,local_48 + (long)local_50);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,local_70[0]);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->Region).super_ParameterBase.empty_ == false) {
    isNonNegative();
    iVar1 = *(int *)&(this->Region).super_ParameterBase.field_0x2c;
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (iVar1 < 0) {
      pcVar2 = (this->Region).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,local_50,local_48 + (long)local_50);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,local_70[0]);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void Component::validate() {
    CheckParameter(Type, isNotEmpty());
    CheckParameter(NMol, isPositive());
    CheckParameter(Region, isNonNegative());
  }